

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-ui-imgui.cc
# Opt level: O3

void __thiscall HostUI::render_draw_lists(HostUI *this,ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  ImDrawList *pIVar3;
  ImDrawCmd *pIVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  ImGuiIO *pIVar7;
  undefined4 in_ECX;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  pIVar7 = ImGui::GetIO();
  iVar12 = (int)((pIVar7->DisplayFramebufferScale).x * (pIVar7->DisplaySize).x);
  iVar13 = (int)((pIVar7->DisplayFramebufferScale).y * (pIVar7->DisplaySize).y);
  auVar6._4_4_ = -(uint)(iVar12 == 0);
  auVar6._0_4_ = -(uint)(iVar12 == 0);
  auVar6._8_4_ = -(uint)(iVar13 == 0);
  auVar6._12_4_ = -(uint)(iVar13 == 0);
  iVar12 = movmskpd(in_ECX,auVar6);
  if (iVar12 != 0) {
    return;
  }
  ImDrawData::ScaleClipRects(draw_data,&pIVar7->DisplayFramebufferScale);
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glDisable(0xb44);
  glDisable(0xb71);
  glEnable(0xc11);
  (*glUseProgram)(this->program);
  (*glUniform1i)(this->uSampler,0);
  (*glUniformMatrix3fv)(this->uProjMatrix,1,'\0',(GLfloat *)this->proj_matrix);
  (*glBindVertexArray)(this->vao);
  if (0 < draw_data->CmdListsCount) {
    lVar11 = 0;
    do {
      pIVar3 = draw_data->CmdLists[lVar11];
      (*glBindBuffer)(0x8892,this->vbo);
      (*glBufferData)(0x8892,(long)(pIVar3->VtxBuffer).Size * 0x14,(pIVar3->VtxBuffer).Data,0x88e0);
      (*glBindBuffer)(0x8893,this->ebo);
      (*glBufferData)(0x8893,(long)(pIVar3->IdxBuffer).Size * 2,(pIVar3->IdxBuffer).Data,0x88e0);
      if (0 < (pIVar3->CmdBuffer).Size) {
        lVar9 = 0;
        lVar8 = 0;
        lVar10 = 0;
        do {
          pIVar4 = (pIVar3->CmdBuffer).Data;
          pcVar5 = *(code **)((long)&pIVar4->UserCallback + lVar9);
          if (pcVar5 == (code *)0x0) {
            glBindTexture(0xde1,*(undefined4 *)((long)&pIVar4->TextureId + lVar9));
            fVar1 = *(float *)((long)&(pIVar4->ClipRect).x + lVar9);
            fVar2 = *(float *)((long)&(pIVar4->ClipRect).w + lVar9);
            glScissor((int)fVar1,(int)((float)iVar13 - fVar2),
                      (int)(*(float *)((long)&(pIVar4->ClipRect).z + lVar9) - fVar1),
                      (int)(fVar2 - *(float *)((long)&(pIVar4->ClipRect).y + lVar9)));
            glDrawElements(4,*(undefined4 *)((long)&pIVar4->ElemCount + lVar9),0x1403,lVar10);
          }
          else {
            (*pcVar5)(pIVar3,(long)&(pIVar4->ClipRect).x + lVar9);
          }
          lVar10 = lVar10 + (ulong)*(uint *)((long)&pIVar4->ElemCount + lVar9) * 2;
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x38;
        } while (lVar8 < (pIVar3->CmdBuffer).Size);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < draw_data->CmdListsCount);
  }
  glDisable(0xc11);
  glDisable(0xbe2);
  return;
}

Assistant:

void HostUI::render_draw_lists(ImDrawData* draw_data) {
  ImGuiIO& io = ImGui::GetIO();
  int fb_width = (int)(io.DisplaySize.x * io.DisplayFramebufferScale.x);
  int fb_height = (int)(io.DisplaySize.y * io.DisplayFramebufferScale.y);
  if (fb_width == 0 || fb_height == 0) {
    return;
  }

  draw_data->ScaleClipRects(io.DisplayFramebufferScale);

  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
  glDisable(GL_CULL_FACE);
  glDisable(GL_DEPTH_TEST);
  glEnable(GL_SCISSOR_TEST);

  glUseProgram(program);
  glUniform1i(uSampler, 0);
  glUniformMatrix3fv(uProjMatrix, 1, GL_FALSE, proj_matrix);
  glBindVertexArray(vao);

  for (int n = 0; n < draw_data->CmdListsCount; n++) {
    const ImDrawList* cmd_list = draw_data->CmdLists[n];
    const ImDrawIdx* idx_buffer_offset = 0;

    glBindBuffer(GL_ARRAY_BUFFER, vbo);
    glBufferData(GL_ARRAY_BUFFER,
                 (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert),
                 (GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);

    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, ebo);
    glBufferData(GL_ELEMENT_ARRAY_BUFFER,
                 (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx),
                 (GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

    for (int i = 0; i < cmd_list->CmdBuffer.Size; i++) {
      const ImDrawCmd* cmd = &cmd_list->CmdBuffer[i];
      if (cmd->UserCallback) {
        cmd->UserCallback(cmd_list, cmd);
      } else {
        glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)cmd->TextureId);
        glScissor((int)cmd->ClipRect.x, (int)(fb_height - cmd->ClipRect.w),
                  (int)(cmd->ClipRect.z - cmd->ClipRect.x),
                  (int)(cmd->ClipRect.w - cmd->ClipRect.y));
        glDrawElements(
            GL_TRIANGLES, (GLsizei)cmd->ElemCount,
            sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT,
            idx_buffer_offset);
      }
      idx_buffer_offset += cmd->ElemCount;
    }
  }

  glDisable(GL_SCISSOR_TEST);
  glDisable(GL_BLEND);
}